

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

void __thiscall btSliderConstraint::getInfo1(btSliderConstraint *this,btConstraintInfo1 *info)

{
  bool bVar1;
  btSliderConstraint *this_00;
  int *in_RSI;
  btSliderConstraint *in_RDI;
  btTransform *in_stack_00000170;
  btTransform *in_stack_00000178;
  btSliderConstraint *in_stack_00000180;
  
  if ((in_RDI->m_useSolveConstraintObsolete & 1U) == 0) {
    *in_RSI = 4;
    in_RSI[1] = 2;
    this_00 = (btSliderConstraint *)
              btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    calculateTransforms(in_stack_00000180,in_stack_00000178,in_stack_00000170);
    testAngLimits(this);
    testLinLimits(this_00);
    bVar1 = getSolveLinLimit(in_RDI);
    if ((bVar1) || (bVar1 = getPoweredLinMotor(in_RDI), bVar1)) {
      *in_RSI = *in_RSI + 1;
      in_RSI[1] = in_RSI[1] + -1;
    }
    bVar1 = getSolveAngLimit(in_RDI);
    if ((bVar1) || (bVar1 = getPoweredAngMotor(in_RDI), bVar1)) {
      *in_RSI = *in_RSI + 1;
      in_RSI[1] = in_RSI[1] + -1;
    }
  }
  else {
    *in_RSI = 0;
    in_RSI[1] = 0;
  }
  return;
}

Assistant:

void btSliderConstraint::getInfo1(btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	}
	else
	{
		info->m_numConstraintRows = 4; // Fixed 2 linear + 2 angular
		info->nub = 2; 
		//prepare constraint
		calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
		testAngLimits();
		testLinLimits();
		if(getSolveLinLimit() || getPoweredLinMotor())
		{
			info->m_numConstraintRows++; // limit 3rd linear as well
			info->nub--; 
		}
		if(getSolveAngLimit() || getPoweredAngMotor())
		{
			info->m_numConstraintRows++; // limit 3rd angular as well
			info->nub--; 
		}
	}
}